

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlDOMWrapNsMapFree(xmlNsMapPtr nsmap)

{
  xmlNsMapItemPtr pxVar1;
  xmlNsMapItemPtr_conflict tmp;
  xmlNsMapItemPtr_conflict cur;
  xmlNsMapPtr nsmap_local;
  
  if (nsmap != (xmlNsMapPtr)0x0) {
    tmp = nsmap->pool;
    while (tmp != (xmlNsMapItemPtr_conflict)0x0) {
      pxVar1 = tmp->next;
      (*xmlFree)(tmp);
      tmp = pxVar1;
    }
    tmp = nsmap->first;
    while (tmp != (xmlNsMapItemPtr_conflict)0x0) {
      pxVar1 = tmp->next;
      (*xmlFree)(tmp);
      tmp = pxVar1;
    }
    (*xmlFree)(nsmap);
  }
  return;
}

Assistant:

static void
xmlDOMWrapNsMapFree(xmlNsMapPtr nsmap)
{
    xmlNsMapItemPtr cur, tmp;

    if (nsmap == NULL)
	return;
    cur = nsmap->pool;
    while (cur != NULL) {
	tmp = cur;
	cur = cur->next;
	xmlFree(tmp);
    }
    cur = nsmap->first;
    while (cur != NULL) {
	tmp = cur;
	cur = cur->next;
	xmlFree(tmp);
    }
    xmlFree(nsmap);
}